

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *other)

{
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> bVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> bVar2;
  byte bVar3;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> bVar4;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> bVar5;
  half_storage hVar6;
  int64_t iVar7;
  undefined8 uVar8;
  int64_t iVar9;
  common_storage cVar10;
  void *__src;
  ulong uVar11;
  bool_storage temp;
  undefined1 auStack_2fe [14];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_2f0;
  undefined1 auStack_2be [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_2a8;
  undefined1 auStack_276 [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_260;
  undefined1 auStack_22e [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_218;
  undefined1 auStack_1e6 [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_1d0;
  undefined1 auStack_19e [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_188;
  undefined1 auStack_156 [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_140;
  undefined1 auStack_d6 [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_c0;
  undefined1 auStack_8e [22];
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbStack_78;
  undefined1 auStack_46 [22];
  
  bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&other->field_0;
  switch((byte)bVar1 & 0xf) {
  case 0:
  case 4:
    cVar10 = (other->field_0).common_;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    goto LAB_0020f2fd;
  case 1:
    bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).boolean_.val_;
    cVar10 = (other->field_0).common_;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    this[2] = bVar1;
LAB_0020f2fd:
    *(common_storage *)this = cVar10;
    break;
  default:
    uVar8 = *(undefined8 *)&other->field_0;
    iVar7 = (other->field_0).int64_.val_;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    *(undefined8 *)this = uVar8;
    *(int64_t *)(this + 8) = iVar7;
    break;
  case 6:
    hVar6 = (other->field_0).half_float_;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    *(half_storage *)this = hVar6;
    break;
  case 7:
    bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    uVar11 = (ulong)((byte)bVar1 >> 4);
    memcpy(auStack_46,(void *)((long)&other->field_0 + 2),uVar11);
    auStack_46[uVar11] = 0;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    *this = bVar1;
    this[1] = bVar2;
    memcpy(this + 2,auStack_46,uVar11);
    this[uVar11 + 2] = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
    break;
  case 10:
  case 0xb:
    bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&other->field_0;
    pbStack_78 = this;
    switch((byte)bVar1 & 0xf) {
    case 0:
    case 4:
      cVar10 = (other->field_0).common_;
      (other->field_0).half_float_ = *(half_storage *)this;
      goto LAB_0020f419;
    case 1:
      bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).boolean_.val_;
      cVar10 = (other->field_0).common_;
      (other->field_0).half_float_ = *(half_storage *)this;
      this[2] = bVar1;
LAB_0020f419:
      *(common_storage *)this = cVar10;
      break;
    default:
      uVar8 = *(undefined8 *)&other->field_0;
      iVar7 = (other->field_0).int64_.val_;
      (other->field_0).half_float_ = *(half_storage *)this;
      *(undefined8 *)this = uVar8;
      *(int64_t *)(this + 8) = iVar7;
      break;
    case 6:
      hVar6 = (other->field_0).half_float_;
      (other->field_0).half_float_ = *(half_storage *)this;
      *(half_storage *)this = hVar6;
      break;
    case 7:
      bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      uVar11 = (ulong)((byte)bVar1 >> 4);
      memcpy(auStack_8e,(void *)((long)&other->field_0 + 2),uVar11);
      auStack_8e[uVar11] = 0;
      (other->field_0).half_float_ = *(half_storage *)this;
      *this = bVar1;
      this[1] = bVar2;
      memcpy(this + 2,auStack_8e,uVar11);
      this[uVar11 + 2] = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
      break;
    case 10:
    case 0xb:
      bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&other->field_0;
      pbStack_c0 = this;
      switch((byte)bVar1 & 0xf) {
      case 0:
      case 4:
        cVar10 = (other->field_0).common_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        goto LAB_0020f53f;
      case 1:
        bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                (other->field_0).boolean_.val_;
        cVar10 = (other->field_0).common_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        this[2] = bVar1;
LAB_0020f53f:
        *(common_storage *)this = cVar10;
        break;
      default:
        uVar8 = *(undefined8 *)&other->field_0;
        iVar7 = (other->field_0).int64_.val_;
        iVar9 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar9;
        *(undefined8 *)this = uVar8;
        *(int64_t *)(this + 8) = iVar7;
        break;
      case 6:
        hVar6 = (other->field_0).half_float_;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *(half_storage *)this = hVar6;
        break;
      case 7:
        bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        uVar11 = (ulong)((byte)bVar1 >> 4);
        memcpy(auStack_d6,(void *)((long)&other->field_0 + 2),uVar11);
        auStack_d6[uVar11] = 0;
        iVar7 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar7;
        *this = bVar1;
        this[1] = bVar2;
        memcpy(this + 2,auStack_d6,uVar11);
        this[uVar11 + 2] = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
        break;
      case 10:
      case 0xb:
        bVar3 = *(byte *)&other->field_0;
        switch(bVar3 & 0xf) {
        case 0:
        case 4:
          cVar10 = (other->field_0).common_;
          bVar1 = *this;
          *(byte *)&other->field_0 = *(byte *)&other->field_0 & 0xf0 | (byte)bVar1 & 0xf;
          bVar2 = *this;
          *(byte *)&other->field_0 = (byte)bVar2 & 0xf0 | (byte)bVar1 & 0xf;
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
          *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar2 >> 4) + 2) = 0;
          *(common_storage *)this = cVar10;
          break;
        case 1:
          bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                  (other->field_0).boolean_.val_;
          cVar10 = (other->field_0).common_;
          bVar2 = *this;
          *(byte *)&other->field_0 = bVar3 & 0xf0 | (byte)bVar2 & 0xf;
          bVar4 = *this;
          *(byte *)&other->field_0 = (byte)bVar4 & 0xf0 | (byte)bVar2 & 0xf;
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
          *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
          *(common_storage *)this = cVar10;
          this[2] = bVar1;
          break;
        default:
          uVar8 = *(undefined8 *)&other->field_0;
          iVar7 = (other->field_0).int64_.val_;
          bVar1 = *this;
          *(byte *)&other->field_0 = bVar3 & 0xf0 | (byte)bVar1 & 0xf;
          bVar2 = *this;
          *(byte *)&other->field_0 = (byte)bVar2 & 0xf0 | (byte)bVar1 & 0xf;
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
          *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar2 >> 4) + 2) = 0;
          *(undefined8 *)this = uVar8;
          *(int64_t *)(this + 8) = iVar7;
          break;
        case 6:
          hVar6 = (other->field_0).half_float_;
          bVar1 = *this;
          *(byte *)&other->field_0 = *(byte *)&other->field_0 & 0xf0 | (byte)bVar1 & 0xf;
          bVar2 = *this;
          *(byte *)&other->field_0 = (byte)bVar2 & 0xf0 | (byte)bVar1 & 0xf;
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
          *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar2 >> 4) + 2) = 0;
          *(half_storage *)this = hVar6;
          break;
        case 7:
          swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                    (this,other);
          return;
        case 10:
        case 0xb:
          bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&other->field_0;
          pbStack_140 = this;
          switch((byte)bVar1 & 0xf) {
          case 0:
          case 4:
            cVar10 = (other->field_0).common_;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            goto LAB_0020f893;
          case 1:
            bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                    (other->field_0).boolean_.val_;
            cVar10 = (other->field_0).common_;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            this[2] = bVar1;
LAB_0020f893:
            *(common_storage *)this = cVar10;
            break;
          default:
            uVar8 = *(undefined8 *)&other->field_0;
            iVar7 = (other->field_0).int64_.val_;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            *(undefined8 *)this = uVar8;
            *(int64_t *)(this + 8) = iVar7;
            break;
          case 6:
            hVar6 = (other->field_0).half_float_;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            *(half_storage *)this = hVar6;
            break;
          case 7:
            bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            uVar11 = (ulong)((byte)bVar1 >> 4);
            memcpy(auStack_156,(void *)((long)&other->field_0 + 2),uVar11);
            auStack_156[uVar11] = 0;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            *this = bVar1;
            this[1] = bVar2;
            memcpy(this + 2,auStack_156,uVar11);
            this[uVar11 + 2] = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
            break;
          case 10:
          case 0xb:
            bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                     &other->field_0;
            pbStack_188 = this;
            switch((byte)bVar1 & 0xf) {
            case 0:
            case 4:
              cVar10 = (other->field_0).common_;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              goto LAB_0020fa27;
            case 1:
              bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                      (other->field_0).boolean_.val_;
              cVar10 = (other->field_0).common_;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              this[2] = bVar1;
LAB_0020fa27:
              *(common_storage *)this = cVar10;
              break;
            default:
              uVar8 = *(undefined8 *)&other->field_0;
              iVar7 = (other->field_0).int64_.val_;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              *(undefined8 *)this = uVar8;
              *(int64_t *)(this + 8) = iVar7;
              break;
            case 6:
              hVar6 = (other->field_0).half_float_;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              *(half_storage *)this = hVar6;
              break;
            case 7:
              bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              uVar11 = (ulong)((byte)bVar1 >> 4);
              memcpy(auStack_19e,(void *)((long)&other->field_0 + 2),uVar11);
              auStack_19e[uVar11] = 0;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              *this = bVar1;
              this[1] = bVar2;
              memcpy(this + 2,auStack_19e,uVar11);
              this[uVar11 + 2] = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
              break;
            case 10:
            case 0xb:
              bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                       &other->field_0;
              pbStack_1d0 = this;
              switch((byte)bVar1 & 0xf) {
              case 0:
              case 4:
                cVar10 = (other->field_0).common_;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                goto LAB_0020fbbf;
              case 1:
                bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                        (other->field_0).boolean_.val_;
                cVar10 = (other->field_0).common_;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                this[2] = bVar1;
LAB_0020fbbf:
                *(common_storage *)this = cVar10;
                break;
              default:
                uVar8 = *(undefined8 *)&other->field_0;
                iVar7 = (other->field_0).int64_.val_;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                *(undefined8 *)this = uVar8;
                *(int64_t *)(this + 8) = iVar7;
                break;
              case 6:
                hVar6 = (other->field_0).half_float_;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                *(half_storage *)this = hVar6;
                break;
              case 7:
                bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                        (other->field_0).common_.tag_;
                uVar11 = (ulong)((byte)bVar1 >> 4);
                memcpy(auStack_1e6,(void *)((long)&other->field_0 + 2),uVar11);
                auStack_1e6[uVar11] = 0;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                *this = bVar1;
                this[1] = bVar2;
                memcpy(this + 2,auStack_1e6,uVar11);
                this[uVar11 + 2] =
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
                break;
              case 10:
              case 0xb:
                bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                         &other->field_0;
                pbStack_218 = this;
                switch((byte)bVar1 & 0xf) {
                case 0:
                case 4:
                  cVar10 = (other->field_0).common_;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  goto LAB_0020fd57;
                case 1:
                  bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                          (other->field_0).boolean_.val_;
                  cVar10 = (other->field_0).common_;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  this[2] = bVar1;
LAB_0020fd57:
                  *(common_storage *)this = cVar10;
                  break;
                default:
                  uVar8 = *(undefined8 *)&other->field_0;
                  iVar7 = (other->field_0).int64_.val_;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *(undefined8 *)this = uVar8;
                  *(int64_t *)(this + 8) = iVar7;
                  break;
                case 6:
                  hVar6 = (other->field_0).half_float_;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *(half_storage *)this = hVar6;
                  break;
                case 7:
                  bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  uVar11 = (ulong)((byte)bVar1 >> 4);
                  memcpy(auStack_22e,(void *)((long)&other->field_0 + 2),uVar11);
                  auStack_22e[uVar11] = 0;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = bVar1;
                  this[1] = bVar2;
                  memcpy(this + 2,auStack_22e,uVar11);
                  this[uVar11 + 2] =
                       (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
                  break;
                case 10:
                case 0xb:
                  bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                           &other->field_0;
                  pbStack_260 = this;
                  switch((byte)bVar1 & 0xf) {
                  case 0:
                  case 4:
                    cVar10 = (other->field_0).common_;
                    iVar7 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar7;
                    goto LAB_0020fe8f;
                  case 1:
                    bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                            (other->field_0).boolean_.val_;
                    cVar10 = (other->field_0).common_;
                    iVar7 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar7;
                    this[2] = bVar1;
LAB_0020fe8f:
                    *(common_storage *)this = cVar10;
                    break;
                  default:
                    uVar8 = *(undefined8 *)&other->field_0;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar9 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar9;
                    *(undefined8 *)this = uVar8;
                    *(int64_t *)(this + 8) = iVar7;
                    break;
                  case 6:
                    hVar6 = (other->field_0).half_float_;
                    iVar7 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar7;
                    *(half_storage *)this = hVar6;
                    break;
                  case 7:
                    bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                            (other->field_0).common_.tag_;
                    uVar11 = (ulong)((byte)bVar1 >> 4);
                    memcpy(auStack_276,(void *)((long)&other->field_0 + 2),uVar11);
                    auStack_276[uVar11] = 0;
                    iVar7 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar7;
                    *this = bVar1;
                    this[1] = bVar2;
                    memcpy(this + 2,auStack_276,uVar11);
                    this[uVar11 + 2] =
                         (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
                    break;
                  case 10:
                  case 0xb:
                    bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                             &other->field_0;
                    pbStack_2a8 = this;
                    switch((byte)bVar1 & 0xf) {
                    case 0:
                    case 4:
                      cVar10 = (other->field_0).common_;
                      iVar7 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar7;
                      goto LAB_0020ffb7;
                    case 1:
                      bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                              (other->field_0).boolean_.val_;
                      cVar10 = (other->field_0).common_;
                      iVar7 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar7;
                      this[2] = bVar1;
LAB_0020ffb7:
                      *(common_storage *)this = cVar10;
                      break;
                    default:
                      uVar8 = *(undefined8 *)&other->field_0;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar9 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar9;
                      *(undefined8 *)this = uVar8;
                      *(int64_t *)(this + 8) = iVar7;
                      break;
                    case 6:
                      hVar6 = (other->field_0).half_float_;
                      iVar7 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar7;
                      *(half_storage *)this = hVar6;
                      break;
                    case 7:
                      bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                              (other->field_0).common_.tag_;
                      uVar11 = (ulong)((byte)bVar1 >> 4);
                      memcpy(auStack_2be,(void *)((long)&other->field_0 + 2),uVar11);
                      auStack_2be[uVar11] = 0;
                      iVar7 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar7;
                      *this = bVar1;
                      this[1] = bVar2;
                      memcpy(this + 2,auStack_2be,uVar11);
                      this[uVar11 + 2] =
                           (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
                      break;
                    case 10:
                    case 0xb:
                      bVar1 = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                               &other->field_0;
                      bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                              (other->field_0).common_.tag_;
                      __src = (void *)((long)&other->field_0 + 2);
                      uVar11 = (ulong)((byte)bVar1 >> 4);
                      pbStack_2f0 = this;
                      memcpy(auStack_2fe,__src,uVar11);
                      auStack_2fe[uVar11] = 0;
                      bVar4 = *this;
                      *(byte *)&other->field_0 = (byte)bVar1 & 0xf0 | (byte)bVar4 & 0xf;
                      bVar5 = *this;
                      *(byte *)&other->field_0 = (byte)bVar5 & 0xf0 | (byte)bVar4 & 0xf;
                      (other->field_0).common_.tag_ = (semantic_tag)this[1];
                      memcpy(__src,this + 2,(ulong)((byte)*this >> 4));
                      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar5 >> 4) + 2) = 0;
                      *this = bVar1;
                      this[1] = bVar2;
                      memcpy(this + 2,auStack_2fe,uVar11);
                      this[uVar11 + 2] =
                           (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0x0;
                      return;
                    case 0xc:
                    case 0xd:
                    case 0xe:
                      bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                              (other->field_0).common_.tag_;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar9 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar9;
                      *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                              ((byte)bVar1 & 0xf);
                      this[1] = bVar2;
                      *(int64_t *)(this + 8) = iVar7;
                      break;
                    case 0xf:
                      bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                              (other->field_0).common_.tag_;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar9 = *(int64_t *)(this + 8);
                      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                      (other->field_0).int64_.val_ = iVar9;
                      *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
                      this[1] = bVar1;
                      *(int64_t *)(this + 8) = iVar7;
                    }
                    return;
                  case 0xc:
                  case 0xd:
                  case 0xe:
                    bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                            (other->field_0).common_.tag_;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar9 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar9;
                    *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                            ((byte)bVar1 & 0xf);
                    this[1] = bVar2;
                    *(int64_t *)(this + 8) = iVar7;
                    break;
                  case 0xf:
                    bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                            (other->field_0).common_.tag_;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar9 = *(int64_t *)(this + 8);
                    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                    (other->field_0).int64_.val_ = iVar9;
                    *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
                    this[1] = bVar1;
                    *(int64_t *)(this + 8) = iVar7;
                  }
                  return;
                case 0xc:
                case 0xd:
                case 0xe:
                  bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  iVar7 = (other->field_0).int64_.val_;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                          ((byte)bVar1 & 0xf);
                  this[1] = bVar2;
                  *(int64_t *)(this + 8) = iVar7;
                  break;
                case 0xf:
                  bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                          (other->field_0).common_.tag_;
                  iVar7 = (other->field_0).int64_.val_;
                  *(byte *)&other->field_0 = (byte)*this & 0xf;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                  *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
                  this[1] = bVar1;
                  *(int64_t *)(this + 8) = iVar7;
                }
                return;
              case 0xc:
              case 0xd:
              case 0xe:
                bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                        (other->field_0).common_.tag_;
                iVar7 = (other->field_0).int64_.val_;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                        ((byte)bVar1 & 0xf);
                this[1] = bVar2;
                *(int64_t *)(this + 8) = iVar7;
                break;
              case 0xf:
                bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                        (other->field_0).common_.tag_;
                iVar7 = (other->field_0).int64_.val_;
                *(byte *)&other->field_0 = (byte)*this & 0xf;
                (other->field_0).common_.tag_ = (semantic_tag)this[1];
                (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
                *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
                this[1] = bVar1;
                *(int64_t *)(this + 8) = iVar7;
              }
              return;
            case 0xc:
            case 0xd:
            case 0xe:
              bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              iVar7 = (other->field_0).int64_.val_;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                      ((byte)bVar1 & 0xf);
              this[1] = bVar2;
              *(int64_t *)(this + 8) = iVar7;
              break;
            case 0xf:
              bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                      (other->field_0).common_.tag_;
              iVar7 = (other->field_0).int64_.val_;
              *(byte *)&other->field_0 = (byte)*this & 0xf;
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
              *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
              this[1] = bVar1;
              *(int64_t *)(this + 8) = iVar7;
            }
            return;
          case 0xc:
          case 0xd:
          case 0xe:
            bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            iVar7 = (other->field_0).int64_.val_;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                    ((byte)bVar1 & 0xf);
            this[1] = bVar2;
            *(int64_t *)(this + 8) = iVar7;
            break;
          case 0xf:
            bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                    (other->field_0).common_.tag_;
            iVar7 = (other->field_0).int64_.val_;
            *(undefined1 *)&other->field_0 = 0xf;
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).int64_.val_ = *(int64_t *)(this + 8);
            *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
            this[1] = bVar1;
            *(int64_t *)(this + 8) = iVar7;
          }
          return;
        case 0xc:
          swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                    (this,other);
          return;
        case 0xd:
          swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                    (this,other);
          return;
        case 0xe:
          swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                    (this,other);
          return;
        case 0xf:
          swap_l_r<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                    (this,other);
          return;
        }
        return;
      case 0xc:
      case 0xd:
      case 0xe:
        bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        iVar7 = (other->field_0).int64_.val_;
        iVar9 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar9;
        *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)((byte)bVar1 & 0xf);
        this[1] = bVar2;
        *(int64_t *)(this + 8) = iVar7;
        break;
      case 0xf:
        bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
                (other->field_0).common_.tag_;
        iVar7 = (other->field_0).int64_.val_;
        iVar9 = *(int64_t *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).int64_.val_ = iVar9;
        *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
        this[1] = bVar1;
        *(int64_t *)(this + 8) = iVar7;
      }
      return;
    case 0xc:
    case 0xd:
    case 0xe:
      bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar7 = (other->field_0).int64_.val_;
      (other->field_0).half_float_ = *(half_storage *)this;
      *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)((byte)bVar1 & 0xf);
      this[1] = bVar2;
      *(int64_t *)(this + 8) = iVar7;
      break;
    case 0xf:
      bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar7 = (other->field_0).int64_.val_;
      (other->field_0).half_float_ = *(half_storage *)this;
      *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
      this[1] = bVar1;
      *(int64_t *)(this + 8) = iVar7;
    }
    return;
  case 0xc:
  case 0xd:
  case 0xe:
    bVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar7 = (other->field_0).int64_.val_;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)((byte)bVar1 & 0xf);
    this[1] = bVar2;
    *(int64_t *)(this + 8) = iVar7;
    break;
  case 0xf:
    bVar1 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar7 = (other->field_0).int64_.val_;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    *this = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>>)0xf;
    this[1] = bVar1;
    *(int64_t *)(this + 8) = iVar7;
  }
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }